

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O3

void anon_unknown.dwarf_24e8db::runtests(bool nonfatal,bool tiny)

{
  int banks;
  long lVar1;
  long lVar2;
  char **channels;
  char **passivechannels;
  PixelType *pt;
  char **channels_00;
  PixelType *pt_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  Box2i *pBVar9;
  Compression *pCVar10;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  *this;
  Header *pHVar11;
  undefined1 nonfatal_00;
  char **passivechannels_00;
  long lVar12;
  undefined1 *puVar13;
  char *pcVar14;
  undefined8 *puVar15;
  undefined1 local_338 [32];
  _Base_ptr p_Stack_318;
  size_t local_310;
  InputFile infile;
  long local_2f0;
  FrameBuffer preReadFrameBuf;
  undefined1 *local_2b0;
  char *local_2a8;
  FrameBuffer readFrameBuf;
  FrameBuffer writeFrameBuf;
  Box2i local_1f8;
  Header hdr;
  ostringstream q;
  ios_base local_138 [264];
  
  random_reseed(1);
  (anonymous_namespace)::gSuccesses = 0;
  (anonymous_namespace)::gOptimisedReads = 0;
  local_2f0 = 0;
  local_2a8 = "RGBHalf";
  local_2b0 = (anonymous_namespace)::Schemes;
  do {
    lVar12 = 0;
    pcVar14 = "RGBHalf";
    puVar13 = (anonymous_namespace)::Schemes;
    do {
      lVar1 = std::cout;
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 2;
      poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_2f0);
      q = (ostringstream)0x2c;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&q,1);
      lVar1 = *(long *)poVar7;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar7 + lVar2 + 0x18) = *(uint *)(poVar7 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar7 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)lVar12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
      std::ostream::flush();
      channels = *(char ***)(local_2b0 + 8);
      passivechannels = *(char ***)(local_2b0 + 0x10);
      iVar6 = *(int *)(local_2b0 + 0x18);
      puVar15 = *(undefined8 **)(local_2b0 + 0x20);
      pt = *(PixelType **)(local_2b0 + 0x28);
      channels_00 = *(char ***)(puVar13 + 8);
      passivechannels_00 = *(char ***)(puVar13 + 0x10);
      banks = *(int *)(puVar13 + 0x18);
      pt_00 = *(PixelType **)(puVar13 + 0x28);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&q);
      sVar8 = strlen(local_2a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,local_2a8,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q," read as ",9);
      sVar8 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,pcVar14,sVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,"...",3);
      lVar1 = std::cout;
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0x35;
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)hdr._map._M_t._M_impl._0_8_,
                 hdr._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
      if ((_Base_ptr *)hdr._map._M_t._M_impl._0_8_ !=
          &hdr._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)hdr._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(hdr._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readFrameBuf._map._M_t._M_impl._0_8_ = 0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Header::Header
                (&hdr,0x80,0x80,1.0,(V2f *)&readFrameBuf,1.0,INCREASING_Y,ZIP_COMPRESSION);
      iVar4 = random_int(0xc9);
      pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
      (pBVar9->min).x = iVar4 + -100;
      iVar4 = random_int(0xc9);
      pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
      (pBVar9->min).y = iVar4 + -100;
      if (nonfatal) {
        pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
        iVar4 = (pBVar9->min).x;
        iVar5 = random_int(0xe);
        pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
        (pBVar9->max).x = iVar4 + iVar5 + 1;
        pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
        iVar4 = (pBVar9->min).y;
        iVar5 = random_int(0xe);
        pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
        iVar4 = iVar4 + iVar5 + 1;
      }
      else {
        pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
        iVar4 = (pBVar9->min).x;
        iVar5 = random_int(400);
        pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
        (pBVar9->max).x = iVar4 + iVar5 + 0x40;
        pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
        iVar4 = (pBVar9->min).y;
        iVar5 = random_int(400);
        pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
        iVar4 = iVar4 + iVar5 + 0x40;
      }
      (pBVar9->max).y = iVar4;
      pCVar10 = Imf_2_5::Header::compression(&hdr);
      *pCVar10 = ZIPS_COMPRESSION;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setupBuffer((ChannelList *)local_338,&hdr,channels,passivechannels,pt,&writeFrameBuf,
                  &readFrameBuf,&preReadFrameBuf,iVar6,true);
      this = (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
              *)Imf_2_5::Header::channels(&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::clear(this);
      if ((_Base_ptr)local_338._16_8_ != (_Base_ptr)0x0) {
        (this->_M_impl).super__Rb_tree_header._M_header._M_color = local_338._8_4_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_338._16_8_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_338._24_8_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_right = p_Stack_318;
        *(_Rb_tree_header **)(local_338._16_8_ + 8) = &(this->_M_impl).super__Rb_tree_header;
        (this->_M_impl).super__Rb_tree_header._M_node_count = local_310;
        local_338._16_8_ = (_Base_ptr)0x0;
        local_338._24_8_ = local_338 + 8;
        local_310 = 0;
        p_Stack_318 = (_Base_ptr)local_338._24_8_;
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                   *)local_338);
      if (puVar15 != (undefined8 *)0x0) {
        infile.super_GenericInputFile._vptr_GenericInputFile = (_func_int **)0x0;
        infile._data = (Data *)0x0;
        pcVar14 = (char *)*puVar15;
        while (pcVar14 != (char *)0x0) {
          puVar15 = puVar15 + 1;
          local_338._0_8_ = local_338 + 0x10;
          sVar8 = strlen(pcVar14);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_338,pcVar14,pcVar14 + sVar8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&infile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338)
          ;
          if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
          }
          pcVar14 = (char *)*puVar15;
        }
        Imf_2_5::addMultiView(&hdr,(StringVector *)&infile);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&infile);
      }
      remove((anonymous_namespace)::filename_abi_cxx11_);
      pcVar14 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar6 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile((OutputFile *)local_338,pcVar14,&hdr,iVar6);
      Imf_2_5::OutputFile::setFrameBuffer((OutputFile *)local_338,&writeFrameBuf);
      pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
      iVar6 = (pBVar9->max).y;
      pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
      Imf_2_5::OutputFile::writePixels((OutputFile *)local_338,(iVar6 - (pBVar9->min).y) + 1);
      pBVar9 = Imf_2_5::Header::dataWindow(&hdr);
      local_1f8.min = pBVar9->min;
      local_1f8.max = pBVar9->max;
      Imf_2_5::OutputFile::~OutputFile((OutputFile *)local_338);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&readFrameBuf);
      Imf_2_5::Header::~Header(&hdr);
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_338._8_4_ = _S_red;
      local_338._16_8_ = (_Base_ptr)0x0;
      local_338._24_8_ = local_338 + 8;
      local_310 = 0;
      p_Stack_318 = (_Base_ptr)local_338._24_8_;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::ostream::flush();
      pcVar14 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar6 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile(&infile,pcVar14,iVar6);
      pHVar11 = Imf_2_5::InputFile::header(&infile);
      setupBuffer((ChannelList *)&hdr,pHVar11,channels_00,passivechannels_00,pt_00,&readFrameBuf,
                  &preReadFrameBuf,(FrameBuffer *)local_338,banks,false);
      nonfatal_00 = SUB81(passivechannels_00,0);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                   *)&hdr);
      Imf_2_5::InputFile::setFrameBuffer(&infile,&readFrameBuf);
      std::ostream::flush();
      pHVar11 = Imf_2_5::InputFile::header(&infile);
      pBVar9 = Imf_2_5::Header::dataWindow(pHVar11);
      iVar6 = (pBVar9->min).y;
      pHVar11 = Imf_2_5::InputFile::header(&infile);
      pBVar9 = Imf_2_5::Header::dataWindow(pHVar11);
      Imf_2_5::InputFile::readPixels(&infile,iVar6,(pBVar9->max).y);
      bVar3 = Imf_2_5::InputFile::isOptimizationEnabled(&infile);
      Imf_2_5::InputFile::~InputFile(&infile);
      compare(&readFrameBuf,&writeFrameBuf,&local_1f8,(bool)nonfatal_00);
      compare(&preReadFrameBuf,(FrameBuffer *)local_338,&local_1f8,(bool)nonfatal_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," OK ",4);
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OPTIMISED ",10);
        (anonymous_namespace)::gOptimisedReads = (anonymous_namespace)::gOptimisedReads + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      (anonymous_namespace)::gSuccesses = (anonymous_namespace)::gSuccesses + 1;
      remove((anonymous_namespace)::filename_abi_cxx11_);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)local_338);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&readFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&writeFrameBuf);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&q);
      std::ios_base::~ios_base(local_138);
      lVar12 = lVar12 + 1;
      puVar13 = (anonymous_namespace)::Schemes + lVar12 * 0x30;
      pcVar14 = *(char **)((anonymous_namespace)::Schemes + lVar12 * 0x30);
    } while (lVar12 != 0x23);
    local_2f0 = local_2f0 + 1;
    local_2b0 = (anonymous_namespace)::Schemes + local_2f0 * 0x30;
    local_2a8 = *(char **)((anonymous_namespace)::Schemes + local_2f0 * 0x30);
  } while (local_2f0 != 0x23);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,0);
  q = (ostringstream)0x2f;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&q,1);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(anonymous_namespace)::gSuccesses);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," runs failed\n",0xd);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7," tests skipped (assumed to be bad)\n",0x23);
  poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(anonymous_namespace)::gOptimisedReads);
  q = (ostringstream)0x2f;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&q,1);
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(anonymous_namespace)::gSuccesses);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," optimised\n",0xb);
  return;
}

Assistant:

void runtests(bool nonfatal,bool tiny)
{
    random_reseed(1);
    int i=0;
    int skipped=0;
    
    gFailures=0;
    gSuccesses=0;
    gOptimisedReads=0;
    
    
    while(Schemes[i]._name!=NULL)
    {
        int j=0;
        while(Schemes[j]._name!=NULL)
        {
           cout << right << setw(2) << i << ',' << right << setw(2) << j << ": ";
           cout.flush();

           if (nonfatal)
           {
               cout << " skipping " << Schemes[i]._name << ',' << Schemes[j]._name << ": known to crash\n";
               skipped++;
           }
           else
           {
               test(Schemes[i],Schemes[j],nonfatal,tiny);
           }
           j++;
        }
        i++;
    }

    cout << gFailures << '/' << (gSuccesses+gFailures) << " runs failed\n";
    cout << skipped << " tests skipped (assumed to be bad)\n";
    cout << gOptimisedReads << '/' << gSuccesses << " optimised\n";
        
    if (gFailures>0 )
    {
        cout << " TESTS FAILED\n";
        assert(false);
    }
}